

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

bool __thiscall
wasm::InsertOrderedSet<wasm::HeapType>::insert(InsertOrderedSet<wasm::HeapType> *this,HeapType *val)

{
  _Self *p_Var1;
  pointer ppVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_false,_true>,_bool>
  pVar3;
  _List_iterator<wasm::HeapType> local_68;
  type_conflict1 *local_60;
  type_conflict1 *inserted;
  type *it;
  undefined1 local_48;
  _List_iterator<wasm::HeapType> local_40;
  pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_> local_38;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_false,_true>,_bool>
  local_28;
  HeapType *local_18;
  HeapType *val_local;
  InsertOrderedSet<wasm::HeapType> *this_local;
  
  local_18 = val;
  val_local = (HeapType *)this;
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(&this->List);
  std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>::
  pair<std::_List_iterator<wasm::HeapType>,_true>(&local_38,val,&local_40);
  pVar3 = std::
          unordered_map<wasm::HeapType,_std::_List_iterator<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>_>_>
          ::insert(&this->Map,&local_38);
  it = (type *)pVar3.first.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_true>
               ._M_cur;
  local_48 = pVar3.second;
  local_28.first.
  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_true>
               )it;
  local_28.second = (bool)local_48;
  inserted = (type_conflict1 *)
             std::
             get<0ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,std::_List_iterator<wasm::HeapType>>,false,true>,bool>
                       (&local_28);
  local_60 = std::
             get<1ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,std::_List_iterator<wasm::HeapType>>,false,true>,bool>
                       (&local_28);
  if ((*local_60 & 1U) != 0) {
    std::__cxx11::list<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (&this->List,local_18);
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(&this->List);
    p_Var1 = std::_List_iterator<wasm::HeapType>::operator--(&local_68);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::HeapType,_std::_List_iterator<wasm::HeapType>_>,_false,_true>
                           *)inserted);
    (ppVar2->second)._M_node = p_Var1->_M_node;
  }
  return (bool)(*local_60 & 1);
}

Assistant:

bool insert(const T& val) {
    auto [it, inserted] = Map.insert({val, List.begin()});
    if (inserted) {
      List.push_back(val);
      it->second = --List.end();
    }
    return inserted;
  }